

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasterizer-a3.cpp
# Opt level: O0

int __thiscall RasterizerA3<4U>::init(RasterizerA3<4U> *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  size_t sVar2;
  BitWord *pBVar3;
  Cell *pCVar4;
  int in_EDX;
  int iVar5;
  int h_local;
  int w_local;
  RasterizerA3<4U> *this_local;
  
  iVar5 = (int)ctx;
  if (((this->super_CellRasterizer).super_Rasterizer._width == iVar5) &&
     ((this->super_CellRasterizer).super_Rasterizer._height == in_EDX)) {
    uVar1 = (*(this->super_CellRasterizer).super_Rasterizer._vptr_Rasterizer[3])();
    this = (RasterizerA3<4U> *)(ulong)uVar1;
  }
  else {
    if (this->_bits != (BitWord *)0x0) {
      free(this->_bits);
    }
    if (this->_cells != (Cell *)0x0) {
      free(this->_cells);
    }
    (this->super_CellRasterizer).super_Rasterizer._width = iVar5;
    (this->super_CellRasterizer).super_Rasterizer._height = in_EDX;
    if ((iVar5 == 0) || (in_EDX == 0)) {
      Bounds::reset(&this->_yBounds);
      this->_bitStride = 0;
      this->_bits = (BitWord *)0x0;
      this->_cellStride = 0;
      this->_cells = (Cell *)0x0;
      this_local._7_1_ = 1;
      goto LAB_0010c9ef;
    }
    sVar2 = IntUtils::nBitWordsForNBits((long)iVar5 + 4U >> 2);
    this->_bitStride = sVar2;
    pBVar3 = (BitWord *)malloc((long)in_EDX * this->_bitStride * 8);
    this->_bits = pBVar3;
    this->_cellStride = (long)(iVar5 + 1);
    pCVar4 = (Cell *)malloc((long)in_EDX * this->_cellStride * 8);
    this->_cells = pCVar4;
    if ((this->_bits == (BitWord *)0x0) || (this->_cells == (Cell *)0x0)) {
      if (this->_bits != (BitWord *)0x0) {
        free(this->_bits);
      }
      if (this->_cells != (Cell *)0x0) {
        free(this->_cells);
      }
      (this->super_CellRasterizer).super_Rasterizer._width = 0;
      (this->super_CellRasterizer).super_Rasterizer._height = 0;
      Bounds::reset(&this->_yBounds);
      this->_bitStride = 0;
      this->_bits = (BitWord *)0x0;
      this->_cellStride = 0;
      this->_cells = (Cell *)0x0;
      this_local._7_1_ = 0;
      goto LAB_0010c9ef;
    }
    Bounds::reset(&this->_yBounds);
    memset(this->_cells,0,
           (long)(this->super_CellRasterizer).super_Rasterizer._height * this->_cellStride * 8);
    this = (RasterizerA3<4U> *)
           memset(this->_bits,0,
                  (long)(this->super_CellRasterizer).super_Rasterizer._height * this->_bitStride * 8
                 );
  }
  this_local._7_1_ = 1;
LAB_0010c9ef:
  return (int)CONCAT71((int7)((ulong)this >> 8),this_local._7_1_);
}

Assistant:

bool RasterizerA3<N>::init(int w, int h) noexcept {
  if (_width != w || _height != h) {
    if (_bits) std::free(_bits);
    if (_cells) std::free(_cells);

    _width = w;
    _height = h;

    if (w == 0 || h == 0) {
      _yBounds.reset();
      _bitStride = 0;
      _bits = nullptr;
      _cellStride = 0;
      _cells = nullptr;
      return true;
    }

    _bitStride = IntUtils::nBitWordsForNBits((size_t(w) + 1 + kPixelsPerOneBit - 1) / kPixelsPerOneBit);
    _bits = static_cast<BitWord*>(std::malloc(h * _bitStride * sizeof(BitWord)));

    _cellStride = w + 1;
    _cells = static_cast<Cell*>(std::malloc(h * _cellStride * sizeof(Cell)));

    if (!_bits || !_cells) {
      if (_bits) std::free(_bits);
      if (_cells) std::free(_cells);

      _width = 0;
      _height = 0;
      _yBounds.reset();

      _bitStride = 0;
      _bits = nullptr;
      _cellStride = 0;
      _cells = nullptr;

      return false;
    }

    _yBounds.reset();

    std::memset(_cells, 0, _height * _cellStride * sizeof(Cell));
    std::memset(_bits, 0, _height * _bitStride * sizeof(BitWord));
  }
  else {
    // This is much faster, will only clear the affected area.
    clear();
  }

  return true;
}